

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_xors(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *bitmap2;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 1;
  do {
    if (count <= uVar2) {
LAB_001033a4:
      return count <= uVar2;
    }
    bitmap1 = roaring_bitmap_xor(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_xor_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "no-run xor incorrect";
LAB_00103369:
      puts(pcVar3);
      goto LAB_001033a4;
    }
    bitmap2 = roaring_bitmap_xor(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_xor_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "runs xors incorrect";
      goto LAB_00103369;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Xors don\'t agree! (slow) ";
      goto LAB_00103369;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Xors don\'t agree!";
LAB_00103377:
      puts(pcVar3);
      puts("\n\nbitmap1:");
      roaring_bitmap_printf_describe(bitmap1);
      puts("\n\nbitmap2:");
      roaring_bitmap_printf_describe(bitmap2);
      goto LAB_001033a4;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    bitmap1 = inplace_xor(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_xor_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] no-run xor incorrect";
      goto LAB_00103369;
    }
    bitmap2 = inplace_xor(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_xor_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] runs xors incorrect";
      goto LAB_00103369;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Xors don\'t agree! (slow) ";
      goto LAB_00103369;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Xors don\'t agree!";
      goto LAB_00103377;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool compare_xors(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                  size_t count) {
    roaring_bitmap_t *tempornorun;
    roaring_bitmap_t *temporruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempornorun = roaring_bitmap_xor(rnorun[i], rnorun[i + 1]);
        if (!is_xor_correct(rnorun[i], rnorun[i + 1])) {
            printf("no-run xor incorrect\n");
            return false;
        }
        temporruns = roaring_bitmap_xor(rruns[i], rruns[i + 1]);
        if (!is_xor_correct(rruns[i], rruns[i + 1])) {
            printf("runs xors incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("Xors don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("Xors don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
        tempornorun = inplace_xor(rnorun[i], rnorun[i + 1]);
        if (!is_xor_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no-run xor incorrect\n");
            return false;
        }
        temporruns = inplace_xor(rruns[i], rruns[i + 1]);
        if (!is_xor_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs xors incorrect\n");
            return false;
        }

        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Xors don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Xors don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
    }
    return true;
}